

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void shunt_map_down(tgestate_t *state)

{
  uint8_t *puVar1;
  
  puVar1 = &(state->map_position).y;
  *puVar1 = *puVar1 + 0xff;
  get_supertiles(state);
  memmove(state->tile_buf + 0x18,state->tile_buf,0x180);
  memmove(state->window_buf + 0xc0,state->window_buf,0xc00);
  plot_horizontal_tiles_common
            (state,state->tile_buf,state->map_buf,(state->map_position).y,state->window_buf);
  return;
}

Assistant:

void shunt_map_down(tgestate_t *state)
{
  assert(state != NULL);

  state->map_position.y--;

  get_supertiles(state);

  memmove(&state->tile_buf[24], &state->tile_buf[0], TILE_BUF_LENGTH - 24);
  // Conv: Original code uses LDDR
  memmove(&state->window_buf[24 * 8], &state->window_buf[0], WINDOW_BUF_LENGTH - 24 * 8);

  plot_topmost_tiles(state);
}